

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_sum.cpp
# Opt level: O2

int si9ma::MinSum::merge(int *arr,int L,int M,int R)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  ulong local_48;
  int *local_40;
  int local_34;
  
  iVar8 = M + 1;
  local_48 = (ulong)(uint)(R - L);
  piVar7 = (int *)((long)&local_48 - ((ulong)((R - L) + 1) * 4 + 0xf & 0xfffffffffffffff0));
  iVar5 = 0;
  local_40 = piVar7;
  local_34 = L;
  while( true ) {
    lVar6 = (long)L;
    if ((M < L) || (R < iVar8)) break;
    iVar1 = arr[lVar6];
    iVar2 = arr[iVar8];
    iVar3 = ((R + 1) - iVar8) * iVar1;
    if (iVar2 <= iVar1) {
      iVar3 = 0;
    }
    iVar4 = iVar2;
    if (iVar1 < iVar2) {
      iVar4 = iVar1;
    }
    iVar5 = iVar5 + iVar3;
    iVar8 = iVar8 + (uint)(iVar2 <= iVar1);
    L = L + (uint)(iVar1 < iVar2);
    *piVar7 = iVar4;
    piVar7 = piVar7 + 1;
  }
  lVar9 = (long)iVar8;
  for (; lVar6 <= M; lVar6 = lVar6 + 1) {
    *piVar7 = arr[lVar6];
    piVar7 = piVar7 + 1;
  }
  for (; lVar9 <= R; lVar9 = lVar9 + 1) {
    *piVar7 = arr[lVar9];
    piVar7 = piVar7 + 1;
  }
  for (lVar6 = 0; lVar6 <= (int)local_48; lVar6 = lVar6 + 1) {
    arr[local_34 + lVar6] = local_40[lVar6];
  }
  return iVar5;
}

Assistant:

int MinSum::merge(int *arr, int L, int M, int R) {
        int left_ptr = L,right_ptr = M + 1,tmp_ptr = 0,tmp_arr_len = R - L + 1,res = 0;
        int tmp_arr[tmp_arr_len];

        while (left_ptr <= M && right_ptr <= R){
            res += arr[left_ptr] < arr[right_ptr] ? arr[left_ptr] * (R - right_ptr + 1) : 0;
            tmp_arr[tmp_ptr++] = arr[left_ptr] < arr[right_ptr] ? arr[left_ptr ++] : arr[right_ptr++];
        }

        while (left_ptr <= M)
            tmp_arr[tmp_ptr ++] = arr[left_ptr++];

        while (right_ptr <= R)
            tmp_arr[tmp_ptr++] = arr[right_ptr++];

        for (int i = 0; i < tmp_arr_len; ++i) {
            arr[L + i] = tmp_arr[i];
        }

        return res;
    }